

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void close_func(LexState *ls)

{
  int iVar1;
  FuncState *fs;
  lua_State *L;
  Proto *pPVar2;
  TString *pTVar3;
  Instruction *pIVar4;
  int *piVar5;
  TValue *pTVar6;
  Proto **ppPVar7;
  LocVar *pLVar8;
  TString **ppTVar9;
  
  fs = ls->fs;
  L = ls->L;
  pPVar2 = fs->f;
  removevars(ls,0);
  luaK_ret(fs,0,0);
  if (-2 < (long)fs->pc) {
    pIVar4 = (Instruction *)
             luaM_realloc_(L,pPVar2->code,(long)pPVar2->sizecode << 2,(long)fs->pc << 2);
    pPVar2->code = pIVar4;
    iVar1 = fs->pc;
    pPVar2->sizecode = iVar1;
    if (-2 < (long)iVar1) {
      piVar5 = (int *)luaM_realloc_(L,pPVar2->lineinfo,(long)pPVar2->sizelineinfo << 2,
                                    (long)iVar1 << 2);
      pPVar2->lineinfo = piVar5;
      pPVar2->sizelineinfo = fs->pc;
      if (-2 < (long)fs->nk) {
        pTVar6 = (TValue *)luaM_realloc_(L,pPVar2->k,(long)pPVar2->sizek << 4,(long)fs->nk << 4);
        pPVar2->k = pTVar6;
        pPVar2->sizek = fs->nk;
        if (-2 < (long)fs->np) {
          ppPVar7 = (Proto **)luaM_realloc_(L,pPVar2->p,(long)pPVar2->sizep << 3,(long)fs->np << 3);
          pPVar2->p = ppPVar7;
          pPVar2->sizep = fs->np;
          if ((long)fs->nlocvars + 1U >> 0x3c == 0) {
            pLVar8 = (LocVar *)
                     luaM_realloc_(L,pPVar2->locvars,(long)pPVar2->sizelocvars << 4,
                                   (long)fs->nlocvars << 4);
            pPVar2->locvars = pLVar8;
            pPVar2->sizelocvars = (int)fs->nlocvars;
            ppTVar9 = (TString **)
                      luaM_realloc_(L,pPVar2->upvalues,(long)pPVar2->sizeupvalues << 3,
                                    (ulong)pPVar2->nups << 3);
            pPVar2->upvalues = ppTVar9;
            pPVar2->sizeupvalues = (uint)pPVar2->nups;
            ls->fs = fs->prev;
            if ((ls->t).token - 0x11dU < 2) {
              pTVar3 = (ls->t).seminfo.ts;
              luaX_newstring(ls,(char *)(pTVar3 + 1),(pTVar3->tsv).len);
            }
            L->top = L->top + -2;
            return;
          }
        }
      }
    }
  }
  luaM_toobig(L);
}

Assistant:

static void close_func(LexState*ls){
lua_State*L=ls->L;
FuncState*fs=ls->fs;
Proto*f=fs->f;
removevars(ls,0);
luaK_ret(fs,0,0);
luaM_reallocvector(L,f->code,f->sizecode,fs->pc,Instruction);
f->sizecode=fs->pc;
luaM_reallocvector(L,f->lineinfo,f->sizelineinfo,fs->pc,int);
f->sizelineinfo=fs->pc;
luaM_reallocvector(L,f->k,f->sizek,fs->nk,TValue);
f->sizek=fs->nk;
luaM_reallocvector(L,f->p,f->sizep,fs->np,Proto*);
f->sizep=fs->np;
luaM_reallocvector(L,f->locvars,f->sizelocvars,fs->nlocvars,LocVar);
f->sizelocvars=fs->nlocvars;
luaM_reallocvector(L,f->upvalues,f->sizeupvalues,f->nups,TString*);
f->sizeupvalues=f->nups;
ls->fs=fs->prev;
if(fs)anchor_token(ls);
L->top-=2;
}